

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmTargetSelectLinker::Choose_abi_cxx11_(string *__return_storage_ptr__,cmTargetSelectLinker *this)

{
  bool bVar1;
  size_type sVar2;
  ostream *poVar3;
  string *psVar4;
  cmLocalGenerator *this_00;
  cmake *this_01;
  reference pbVar5;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_238;
  cmListFileBacktrace local_230;
  string local_1f0;
  cmake *local_1d0;
  cmake *cm;
  _Self local_1c0;
  const_iterator li;
  stringstream e;
  ostream local_1a8;
  allocator local_19;
  cmTargetSelectLinker *local_18;
  cmTargetSelectLinker *this_local;
  
  local_18 = this;
  this_local = (cmTargetSelectLinker *)__return_storage_ptr__;
  bVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->Preferred);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    sVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->Preferred);
    if (1 < sVar2) {
      std::__cxx11::stringstream::stringstream((stringstream *)&li);
      poVar3 = std::operator<<(&local_1a8,"Target ");
      psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
      poVar3 = std::operator<<(poVar3,(string *)psVar4);
      poVar3 = std::operator<<(poVar3,
                               " contains multiple languages with the highest linker preference");
      poVar3 = std::operator<<(poVar3," (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->Preference);
      std::operator<<(poVar3,"):\n");
      local_1c0._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->Preferred);
      while( true ) {
        cm = (cmake *)std::
                      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::end(&this->Preferred);
        bVar1 = std::operator!=(&local_1c0,(_Self *)&cm);
        if (!bVar1) break;
        poVar3 = std::operator<<(&local_1a8,"  ");
        pbVar5 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_1c0);
        poVar3 = std::operator<<(poVar3,(string *)pbVar5);
        std::operator<<(poVar3,"\n");
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_1c0);
      }
      std::operator<<(&local_1a8,"Set the LINKER_LANGUAGE property for this target.");
      this_00 = cmGeneratorTarget::GetLocalGenerator(this->Target);
      this_01 = cmLocalGenerator::GetCMakeInstance(this_00);
      local_1d0 = this_01;
      std::__cxx11::stringstream::str();
      cmGeneratorTarget::GetBacktrace(&local_230,this->Target);
      cmake::IssueMessage(this_01,FATAL_ERROR,&local_1f0,&local_230,false);
      cmListFileBacktrace::~cmListFileBacktrace(&local_230);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::stringstream::~stringstream((stringstream *)&li);
    }
    local_238._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&this->Preferred);
    pbVar5 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_238);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Choose()
    {
    if(this->Preferred.empty())
      {
      return "";
      }
    else if(this->Preferred.size() > 1)
      {
      std::stringstream e;
      e << "Target " << this->Target->GetName()
        << " contains multiple languages with the highest linker preference"
        << " (" << this->Preference << "):\n";
      for(std::set<std::string>::const_iterator
            li = this->Preferred.begin(); li != this->Preferred.end(); ++li)
        {
        e << "  " << *li << "\n";
        }
      e << "Set the LINKER_LANGUAGE property for this target.";
      cmake* cm = this->Target->GetLocalGenerator()->GetCMakeInstance();
      cm->IssueMessage(cmake::FATAL_ERROR, e.str(),
                       this->Target->GetBacktrace());
      }
    return *this->Preferred.begin();
    }